

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert_to_half_pass.cpp
# Opt level: O0

bool __thiscall
spvtools::opt::ConvertToHalfPass::GenHalfInst(ConvertToHalfPass *this,Instruction *inst)

{
  bool bVar1;
  uint32_t id;
  Op OVar2;
  size_type sVar3;
  Op local_20;
  byte local_1a;
  bool local_19;
  bool inst_relaxed;
  Instruction *pIStack_18;
  bool modified;
  Instruction *inst_local;
  ConvertToHalfPass *this_local;
  
  local_19 = false;
  pIStack_18 = inst;
  inst_local = (Instruction *)this;
  id = Instruction::result_id(inst);
  local_1a = IsRelaxed(this,id);
  bVar1 = IsArithmetic(this,pIStack_18);
  if ((bVar1) && ((local_1a & 1) != 0)) {
    local_19 = GenHalfArith(this,pIStack_18);
  }
  else {
    OVar2 = Instruction::opcode(pIStack_18);
    if ((OVar2 == OpPhi) && ((local_1a & 1) != 0)) {
      local_19 = ProcessPhi(this,pIStack_18,0x20,0x10);
    }
    else {
      OVar2 = Instruction::opcode(pIStack_18);
      if (OVar2 == OpFConvert) {
        local_19 = ProcessConvert(this,pIStack_18);
      }
      else {
        local_20 = Instruction::opcode(pIStack_18);
        sVar3 = std::
                unordered_set<spv::Op,_spvtools::opt::ConvertToHalfPass::hasher,_std::equal_to<spv::Op>,_std::allocator<spv::Op>_>
                ::count(&this->image_ops_,&local_20);
        if (sVar3 == 0) {
          local_19 = ProcessDefault(this,pIStack_18);
        }
        else {
          local_19 = ProcessImageRef(this,pIStack_18);
        }
      }
    }
  }
  return local_19;
}

Assistant:

bool ConvertToHalfPass::GenHalfInst(Instruction* inst) {
  bool modified = false;
  // Remember id for later deletion of RelaxedPrecision decoration
  bool inst_relaxed = IsRelaxed(inst->result_id());
  if (IsArithmetic(inst) && inst_relaxed)
    modified = GenHalfArith(inst);
  else if (inst->opcode() == spv::Op::OpPhi && inst_relaxed)
    modified = ProcessPhi(inst, 32u, 16u);
  else if (inst->opcode() == spv::Op::OpFConvert)
    modified = ProcessConvert(inst);
  else if (image_ops_.count(inst->opcode()) != 0)
    modified = ProcessImageRef(inst);
  else
    modified = ProcessDefault(inst);
  return modified;
}